

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlAddSibling(xmlNodePtr cur,xmlNodePtr elem)

{
  _xmlNode *p_Var1;
  xmlNodePtr pxVar2;
  
  if ((cur == (xmlNodePtr)0x0) || (elem == (xmlNodePtr)0x0 || cur->type == XML_NAMESPACE_DECL)) {
    pxVar2 = (xmlNodePtr)0x0;
  }
  else {
    pxVar2 = (xmlNodePtr)0x0;
    if ((cur != elem) && (elem->type != XML_NAMESPACE_DECL)) {
      if (cur->type == XML_ATTRIBUTE_NODE) goto LAB_00183b00;
      p_Var1 = cur->parent;
      if (p_Var1 == (_xmlNode *)0x0) goto LAB_00183b00;
      if (p_Var1->children == (_xmlNode *)0x0) goto LAB_00183b00;
      pxVar2 = p_Var1->last;
      if (pxVar2 == (xmlNodePtr)0x0) goto LAB_00183b00;
      p_Var1 = pxVar2->next;
      while (p_Var1 != (_xmlNode *)0x0) {
LAB_00183b00:
        p_Var1 = cur->next;
        pxVar2 = cur;
        cur = p_Var1;
      }
      xmlUnlinkNode(elem);
      if (elem->type == XML_TEXT_NODE && pxVar2->type == XML_TEXT_NODE) {
        if (pxVar2->name == elem->name) {
          xmlNodeAddContent(pxVar2,elem->content);
          xmlFreeNode(elem);
          return pxVar2;
        }
      }
      else if (elem->type == XML_ATTRIBUTE_NODE) {
        pxVar2 = xmlAddPropSibling(pxVar2,pxVar2,elem);
        return pxVar2;
      }
      if (elem->doc != pxVar2->doc) {
        xmlSetTreeDoc(elem,pxVar2->doc);
      }
      p_Var1 = pxVar2->parent;
      elem->prev = pxVar2;
      elem->next = (_xmlNode *)0x0;
      elem->parent = p_Var1;
      pxVar2->next = elem;
      pxVar2 = elem;
      if (p_Var1 != (_xmlNode *)0x0) {
        p_Var1->last = elem;
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlNodePtr
xmlAddSibling(xmlNodePtr cur, xmlNodePtr elem) {
    xmlNodePtr parent;

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddSibling : cur == NULL\n");
#endif
	return(NULL);
    }

    if ((elem == NULL) || (elem->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddSibling : elem == NULL\n");
#endif
	return(NULL);
    }

    if (cur == elem) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddSibling : cur == elem\n");
#endif
	return(NULL);
    }

    /*
     * Constant time is we can rely on the ->parent->last to find
     * the last sibling.
     */
    if ((cur->type != XML_ATTRIBUTE_NODE) && (cur->parent != NULL) &&
	(cur->parent->children != NULL) &&
	(cur->parent->last != NULL) &&
	(cur->parent->last->next == NULL)) {
	cur = cur->parent->last;
    } else {
	while (cur->next != NULL) cur = cur->next;
    }

    xmlUnlinkNode(elem);

    if ((cur->type == XML_TEXT_NODE) && (elem->type == XML_TEXT_NODE) &&
        (cur->name == elem->name)) {
	xmlNodeAddContent(cur, elem->content);
	xmlFreeNode(elem);
	return(cur);
    } else if (elem->type == XML_ATTRIBUTE_NODE) {
		return xmlAddPropSibling(cur, cur, elem);
    }

    if (elem->doc != cur->doc) {
	xmlSetTreeDoc(elem, cur->doc);
    }
    parent = cur->parent;
    elem->prev = cur;
    elem->next = NULL;
    elem->parent = parent;
    cur->next = elem;
    if (parent != NULL)
	parent->last = elem;

    return(elem);
}